

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseName(xmlParserCtxtPtr ctxt)

{
  int *piVar1;
  byte bVar2;
  byte *name;
  xmlParserInputPtr pxVar3;
  xmlParserErrors error;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined8 in_RAX;
  xmlChar *pxVar7;
  xmlChar **ppxVar8;
  long lVar9;
  char *info;
  xmlDictPtr dict;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uStack_38;
  
  uVar11 = 10000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar11 = 50000;
  }
  uStack_38 = in_RAX;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  name = ctxt->input->cur;
  bVar2 = *name;
  if ((((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a) || (bVar2 == 0x5f)) || (bVar2 == 0x3a)) {
    uVar13 = 1;
    while (((bVar2 = name[uVar13], (byte)(bVar2 - 0x30) < 10 ||
            ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) ||
           ((bVar2 - 0x2d < 0x33 && ((0x4000000002003U >> ((ulong)(bVar2 - 0x2d) & 0x3f) & 1) != 0))
           ))) {
      uVar13 = uVar13 + 1;
    }
    if ((bVar2 == 0) || ((char)bVar2 < '\0')) goto LAB_0015578c;
    if (uVar13 <= uVar11) {
      pxVar7 = xmlDictLookup(ctxt->dict,name,(int)uVar13);
      pxVar3 = ctxt->input;
      pxVar3->cur = name + uVar13;
      piVar1 = &pxVar3->col;
      *piVar1 = *piVar1 + (int)uVar13;
      if (pxVar7 == (xmlChar *)0x0) {
        xmlErrMemory(ctxt,(char *)0x0);
        return (xmlChar *)0x0;
      }
      return pxVar7;
    }
  }
  else {
LAB_0015578c:
    iVar12 = 10000000;
    if ((ctxt->options & 0x80000) == 0) {
      iVar12 = 50000;
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)name < 0xfa)) {
      xmlGROW(ctxt);
    }
    if (ctxt->instate == XML_PARSER_EOF) {
      return (xmlChar *)0x0;
    }
    uVar4 = xmlCurrentChar(ctxt,(int *)((long)&uStack_38 + 4));
    if ((ctxt->options & 0x20000) == 0) {
      if ((uVar4 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
        return (xmlChar *)0x0;
      }
      if (((0x19 < (uVar4 & 0xffffffdf) - 0x41) && (uVar4 != 0x3a)) && (uVar4 != 0x5f)) {
        auVar16._0_4_ = -(uint)(-0x7fffe380 < (int)(uVar4 - 0x37f ^ 0x80000000));
        auVar16._4_4_ = -(uint)(-0x7ffffee1 < (int)(uVar4 - 0x2070 ^ 0x80000000));
        auVar16._8_4_ = -(uint)(-0x7ffffc11 < (int)(uVar4 - 0x2c00 ^ 0x80000000));
        auVar16._12_4_ = -(uint)(-0x7fff5802 < (int)(uVar4 - 0x3001 ^ 0x80000000));
        auVar14._0_4_ = -(uint)(-0x7fffffea < (int)(uVar4 - 0xc0 ^ 0x80000000));
        auVar14._4_4_ = -(uint)(-0x7fffffe2 < (int)(uVar4 - 0xd8 ^ 0x80000000));
        auVar14._8_4_ = -(uint)(-0x7ffffdf9 < (int)(uVar4 - 0xf8 ^ 0x80000000));
        auVar14._12_4_ = -(uint)(-0x7ffffff3 < (int)(uVar4 - 0x370 ^ 0x80000000));
        auVar14 = packssdw(auVar14,auVar16);
        auVar14 = packsswb(auVar14,auVar14);
        if ((((0xdffff < uVar4 - 0x10000 && 0x20d < uVar4 - 0xfdf0) && 0x4cf < uVar4 - 0xf900) &&
            (uVar4 & 0xfffffffe) != 0x200c) &&
            (byte)(SUB161(auVar14 >> 7,0) & 1 | (SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar14 >> 0x17,0) & 1) << 2 | (SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar14 >> 0x27,0) & 1) << 4 | (SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar14 >> 0x37,0) & 1) << 6 | SUB161(auVar14 >> 0x3f,0) << 7) == 0xff) {
          return (xmlChar *)0x0;
        }
      }
      pxVar3 = ctxt->input;
      pxVar7 = pxVar3->cur;
      if (*pxVar7 == '\n') {
        pxVar3->line = pxVar3->line + 1;
        pxVar3->col = 1;
      }
      else {
        pxVar3->col = pxVar3->col + 1;
      }
      ppxVar8 = &pxVar3->cur;
      iVar10 = 0;
      uVar4 = uStack_38._4_4_;
      while( true ) {
        *ppxVar8 = pxVar7 + (int)uStack_38._4_4_;
        uVar5 = xmlCurrentChar(ctxt,(int *)((long)&uStack_38 + 4));
        if ((uVar5 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) break;
        if (((10 < uVar5 - 0x30) && (0x19 < (uVar5 & 0xffffffdf) - 0x41)) &&
           (((0x32 < uVar5 - 0x2d || ((0x4000000000003U >> ((ulong)(uVar5 - 0x2d) & 0x3f) & 1) == 0)
             ) && (uVar5 != 0xb7)))) {
          auVar15._0_4_ = -(uint)(-0x7fffffff < (int)(uVar5 - 0x203f ^ 0x80000000));
          auVar15._4_4_ = -(uint)(-0x7ffffee1 < (int)(uVar5 - 0x2070 ^ 0x80000000));
          auVar15._8_4_ = -(uint)(-0x7ffffc11 < (int)(uVar5 - 0x2c00 ^ 0x80000000));
          auVar15._12_4_ = -(uint)(-0x7fff5802 < (int)(uVar5 - 0x3001 ^ 0x80000000));
          auVar17._0_4_ = -(uint)(-0x7fffffea < (int)(uVar5 - 0xc0 ^ 0x80000000));
          auVar17._4_4_ = -(uint)(-0x7fffffe2 < (int)(uVar5 - 0xd8 ^ 0x80000000));
          auVar17._8_4_ = -(uint)(-0x7ffffd7b < (int)(uVar5 - 0xf8 ^ 0x80000000));
          auVar17._12_4_ = -(uint)(-0x7fffe380 < (int)(uVar5 - 0x37f ^ 0x80000000));
          auVar14 = packssdw(auVar17,auVar15);
          auVar14 = packsswb(auVar14,auVar14);
          if ((bool)(~(((uVar5 - 0x10000 < 0xe0000 || uVar5 - 0xfdf0 < 0x20e) ||
                       uVar5 - 0xf900 < 0x4d0) ||
                      (byte)(SUB161(auVar14 >> 7,0) & 1 | (SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar14 >> 0x37,0) & 1) << 6 | SUB161(auVar14 >> 0x3f,0) << 7)
                      != 0xff) & (uVar5 & 0xfffffffe) != 0x200c)) break;
        }
        if (iVar10 < 0x65) {
          iVar10 = iVar10 + 1;
        }
        else {
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          iVar10 = 0;
          if (ctxt->instate == XML_PARSER_EOF) {
            return (xmlChar *)0x0;
          }
        }
        uVar5 = uStack_38._4_4_;
        if ((int)(uStack_38._4_4_ ^ 0x7fffffff) < (int)uVar4) {
          uVar5 = 0;
        }
        uVar4 = uVar4 + uVar5;
        pxVar3 = ctxt->input;
        ppxVar8 = &pxVar3->cur;
        pxVar7 = pxVar3->cur;
        if (*pxVar7 == '\n') {
          pxVar3->line = pxVar3->line + 1;
          pxVar3->col = 1;
        }
        else {
          pxVar3->col = pxVar3->col + 1;
        }
      }
    }
    else {
      if ((uVar4 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
        return (xmlChar *)0x0;
      }
      if ((int)uVar4 < 0x100) {
        if ((((0x16 < uVar4 - 0xc0 && 0x19 < (uVar4 & 0xffffffdf) - 0x41) &&
             ((int)uVar4 < 0xf8 && 0x1e < uVar4 - 0xd8)) && (uVar4 != 0x5f)) && (uVar4 != 0x3a)) {
          return (xmlChar *)0x0;
        }
      }
      else {
        iVar10 = xmlCharInRange(uVar4,&xmlIsBaseCharGroup);
        if ((iVar10 == 0) && ((8 < uVar4 - 0x3021 && 0x51a5 < uVar4 - 0x4e00) && uVar4 != 0x3007)) {
          return (xmlChar *)0x0;
        }
      }
      pxVar3 = ctxt->input;
      pxVar7 = pxVar3->cur;
      if (*pxVar7 == '\n') {
        pxVar3->line = pxVar3->line + 1;
        pxVar3->col = 1;
      }
      else {
        pxVar3->col = pxVar3->col + 1;
      }
      ppxVar8 = &pxVar3->cur;
      iVar10 = 0;
      uVar4 = uStack_38._4_4_;
      while( true ) {
        *ppxVar8 = pxVar7 + (int)uStack_38._4_4_;
        uVar5 = xmlCurrentChar(ctxt,(int *)((long)&uStack_38 + 4));
        if ((uVar5 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) break;
        if ((int)uVar5 < 0x100) {
          if ((((0x16 < uVar5 - 0xc0) && (0x19 < (uVar5 & 0xffffffdf) - 0x41)) && (9 < uVar5 - 0x30)
              ) && (((int)uVar5 < 0xf8 && (0x1e < uVar5 - 0xd8)))) {
LAB_00155c4f:
            if ((0x32 < uVar5 - 0x2d) ||
               ((0x4000000002003U >> ((ulong)(uVar5 - 0x2d) & 0x3f) & 1) == 0)) {
              if ((int)uVar5 < 0x100) {
                uVar5 = (uint)(uVar5 == 0xb7);
              }
              else {
                iVar6 = xmlCharInRange(uVar5,&xmlIsCombiningGroup);
                if (iVar6 != 0) goto LAB_00155c67;
                uVar5 = xmlCharInRange(uVar5,&xmlIsExtenderGroup);
              }
              if (uVar5 == 0) break;
            }
          }
        }
        else {
          iVar6 = xmlCharInRange(uVar5,&xmlIsBaseCharGroup);
          if (((iVar6 == 0) && ((8 < uVar5 - 0x3021 && 0x51a5 < uVar5 - 0x4e00) && uVar5 != 0x3007))
             && (iVar6 = xmlCharInRange(uVar5,&xmlIsDigitGroup), iVar6 == 0)) goto LAB_00155c4f;
        }
LAB_00155c67:
        if (iVar10 < 0x65) {
          iVar10 = iVar10 + 1;
        }
        else {
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          iVar10 = 0;
          if (ctxt->instate == XML_PARSER_EOF) {
            return (xmlChar *)0x0;
          }
        }
        uVar5 = uStack_38._4_4_;
        if ((int)(uStack_38._4_4_ ^ 0x7fffffff) < (int)uVar4) {
          uVar5 = 0;
        }
        uVar4 = uVar4 + uVar5;
        pxVar3 = ctxt->input;
        ppxVar8 = &pxVar3->cur;
        pxVar7 = pxVar3->cur;
        if (*pxVar7 == '\n') {
          pxVar3->line = pxVar3->line + 1;
          pxVar3->col = 1;
        }
        else {
          pxVar3->col = pxVar3->col + 1;
        }
      }
    }
    if ((int)uVar4 <= iVar12) {
      pxVar7 = ctxt->input->cur;
      if ((long)(int)uVar4 <= (long)pxVar7 - (long)ctxt->input->base) {
        if ((*pxVar7 == '\n') && (pxVar7[-1] == '\r')) {
          dict = ctxt->dict;
          lVar9 = (long)(int)~uVar4;
        }
        else {
          dict = ctxt->dict;
          lVar9 = -(long)(int)uVar4;
        }
        pxVar7 = xmlDictLookup(dict,pxVar7 + lVar9,uVar4);
        return pxVar7;
      }
      info = "unexpected change of input buffer";
      error = XML_ERR_INTERNAL_ERROR;
      goto LAB_00155d3b;
    }
  }
  info = "Name";
  error = XML_ERR_NAME_TOO_LONG;
LAB_00155d3b:
  xmlFatalErr(ctxt,error,info);
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlParseName(xmlParserCtxtPtr ctxt) {
    const xmlChar *in;
    const xmlChar *ret;
    size_t count = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_TEXT_LENGTH :
                       XML_MAX_NAME_LENGTH;

    GROW;

#ifdef DEBUG
    nbParseName++;
#endif

    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->input->cur;
    if (((*in >= 0x61) && (*in <= 0x7A)) ||
	((*in >= 0x41) && (*in <= 0x5A)) ||
	(*in == '_') || (*in == ':')) {
	in++;
	while (((*in >= 0x61) && (*in <= 0x7A)) ||
	       ((*in >= 0x41) && (*in <= 0x5A)) ||
	       ((*in >= 0x30) && (*in <= 0x39)) ||
	       (*in == '_') || (*in == '-') ||
	       (*in == ':') || (*in == '.'))
	    in++;
	if ((*in > 0) && (*in < 0x80)) {
	    count = in - ctxt->input->cur;
            if (count > maxLength) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "Name");
                return(NULL);
            }
	    ret = xmlDictLookup(ctxt->dict, ctxt->input->cur, count);
	    ctxt->input->cur = in;
	    ctxt->input->col += count;
	    if (ret == NULL)
	        xmlErrMemory(ctxt, NULL);
	    return(ret);
	}
    }
    /* accelerator for special cases */
    return(xmlParseNameComplex(ctxt));
}